

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::~StreamReporter(StreamReporter *this)

{
  Printer *this_00;
  pointer puVar1;
  _Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false> _Var2;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__StreamReporter_004bda88;
  if (this->delete_printer_ == true) {
    this_00 = this->printer_;
    if (this_00 != (Printer *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&this_00->line_start_variables_);
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)&this_00->substitutions_);
      (*(this_00->substitution_listener_).
        super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
        .
        super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
        .manager_)(dispose,(TypeErasedState *)&this_00->substitution_listener_,
                   (TypeErasedState *)&this_00->substitution_listener_);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&this_00->annotation_lookups_);
      std::
      vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ::~vector(&this_00->var_lookups_);
      puVar1 = (this_00->paren_depth_to_omit_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1,(long)(this_00->paren_depth_to_omit_).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar1);
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::~ZeroCopyStreamByteSink(&this_00->sink_);
    }
    operator_delete(this_00,0x130);
  }
  _Var2._M_head_impl =
       (this->unpack_any_field_).dynamic_message_factory_._M_t.
       super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
       .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (DynamicMessageFactory *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_MessageFactory + 8))();
  }
  (this->unpack_any_field_).dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl =
       (DynamicMessageFactory *)0x0;
  return;
}

Assistant:

MessageDifferencer::StreamReporter::~StreamReporter() {
  if (delete_printer_) delete printer_;
}